

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_str_safe(char *data,ptrdiff_t *data_sz,char *str,uint32_t len)

{
  int iVar1;
  char *__dest;
  
  if (data_sz != (ptrdiff_t *)0x0) {
    if (len < 0x20) {
      iVar1 = 1;
    }
    else if (len < 0x100) {
      iVar1 = 2;
    }
    else {
      iVar1 = (uint)(0xffff < len) * 2 + 3;
    }
    *data_sz = *data_sz - (ulong)(iVar1 + len);
    if (*data_sz < 0) {
      return data;
    }
  }
  __dest = mp_encode_strl(data,len);
  memcpy(__dest,str,(ulong)len);
  return __dest + len;
}

Assistant:

MP_IMPL char *
mp_encode_str_safe(char *data, ptrdiff_t *data_sz,
		   const char *str, uint32_t len)
{
	if (data_sz != NULL) {
		*data_sz -= mp_sizeof_str(len);
		if (*data_sz < 0)
			return data;
	}
	return mp_encode_str(data, str, len);
}